

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

TResourceType __thiscall
glslang::TDefaultHlslIoResolver::getResourceType(TDefaultHlslIoResolver *this,TType *type)

{
  bool bVar1;
  TType *type_local;
  TDefaultHlslIoResolver *this_local;
  
  bVar1 = TDefaultIoResolverBase::isUavType(type);
  if (bVar1) {
    this_local._4_4_ = EResUav;
  }
  else {
    bVar1 = TDefaultIoResolverBase::isSrvType(type);
    if (bVar1) {
      this_local._4_4_ = EResTexture;
    }
    else {
      bVar1 = TDefaultIoResolverBase::isSamplerType(type);
      if (bVar1) {
        this_local._4_4_ = EResSampler;
      }
      else {
        bVar1 = TDefaultIoResolverBase::isUboType(type);
        if (bVar1) {
          this_local._4_4_ = EResUbo;
        }
        else {
          this_local._4_4_ = EResCount;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

TResourceType getResourceType(const glslang::TType& type) override {
        if (isUavType(type)) {
            return EResUav;
        }
        if (isSrvType(type)) {
            return EResTexture;
        }
        if (isSamplerType(type)) {
            return EResSampler;
        }
        if (isUboType(type)) {
            return EResUbo;
        }
        return EResCount;
    }